

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::function_signature<int(Unique_Ptr_Test_Base_Class::*)()const>
               (offset_in_Unique_Ptr_Test_Base_Class_to_subr *f)

{
  offset_in_Unique_Ptr_Test_Base_Class_to_subr *f_local;
  
  Function_Signature<int,chaiscript::dispatch::detail::Function_Params<Unique_Ptr_Test_Base_Class_const&>,false,true,false,false>
  ::Function_Signature<int(Unique_Ptr_Test_Base_Class::*const&)()const>
            ((Function_Signature<int,chaiscript::dispatch::detail::Function_Params<Unique_Ptr_Test_Base_Class_const&>,false,true,false,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }